

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::collectremovepoints(tetgenmesh *this,arraypool *remptlist)

{
  uint *puVar1;
  byte bVar2;
  tetgenbehavior *ptVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int iVar7;
  point pdVar8;
  long lVar9;
  arraypool *paVar10;
  uint uVar11;
  char *unaff_RBP;
  int iVar12;
  uint uVar13;
  long lVar14;
  double dVar15;
  char *local_48;
  double local_40;
  arraypool *local_38;
  
  if (this->b->metric != 0) {
    memorypool::traversalinit(this->points);
    pdVar8 = pointtraverse(this);
    while (pdVar8 != (point)0x0) {
      if (0.0 < pdVar8[this->pointmtrindex]) {
        getvertexstar(this,1,pdVar8,this->cavetetlist,this->cavetetvertlist,(arraypool *)0x0);
        unaff_RBP = *this->cavetetvertlist->toparray;
        dVar15 = distance(this,pdVar8,*(double **)unaff_RBP);
        for (lVar14 = 1; paVar10 = this->cavetetvertlist, lVar14 < paVar10->objects;
            lVar14 = lVar14 + 1) {
          lVar9 = (long)paVar10->objectbytes *
                  (long)(int)(paVar10->objectsperblockmark & (uint)lVar14);
          unaff_RBP = paVar10->toparray[(uint)lVar14 >> ((byte)paVar10->log2objectsperblock & 0x1f)]
                      + lVar9;
          local_40 = dVar15;
          dVar15 = distance(this,pdVar8,
                            *(double **)
                             (paVar10->toparray
                              [(uint)lVar14 >> ((byte)paVar10->log2objectsperblock & 0x1f)] + lVar9)
                           );
          if (local_40 <= dVar15) {
            dVar15 = local_40;
          }
        }
        paVar10->objects = 0;
        this->cavetetlist->objects = 0;
        local_48 = unaff_RBP;
        if (dVar15 < pdVar8[this->pointmtrindex]) {
          puVar1 = (uint *)((long)pdVar8 + (long)this->pointmarkindex * 4 + 4);
          *puVar1 = *puVar1 | 1;
          arraypool::newindex(remptlist,&local_48);
          *(point *)local_48 = pdVar8;
          unaff_RBP = local_48;
        }
      }
      pdVar8 = pointtraverse(this);
    }
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld oversized points.\n",remptlist->objects);
    }
  }
  if (this->in->pointmarkerlist != (int *)0x0) {
    local_40 = (double)remptlist->objects;
    memorypool::traversalinit(this->points);
    pdVar8 = pointtraverse(this);
    for (lVar14 = 0; (pdVar8 != (point)0x0 && (lVar14 < this->in->numberofpoints));
        lVar14 = lVar14 + 1) {
      if (this->in->pointmarkerlist[lVar14] == -1) {
        puVar1 = (uint *)((long)pdVar8 + (long)this->pointmarkindex * 4 + 4);
        *puVar1 = *puVar1 | 1;
        arraypool::newindex(remptlist,&local_48);
        *(point *)local_48 = pdVar8;
        unaff_RBP = local_48;
      }
      pdVar8 = pointtraverse(this);
    }
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld marked points.\n",remptlist->objects - (long)local_40);
    }
  }
  ptVar3 = this->b;
  if (0 < ptVar3->coarsen_param) {
    if (1 < ptVar3->verbose) {
      printf("    Coarsen %g percent of interior points.\n",ptVar3->coarsen_percent * 100.0);
    }
    paVar10 = (arraypool *)operator_new(0x30);
    paVar10->objectbytes = 8;
    paVar10->objectsperblock = 0x400;
    paVar10->log2objectsperblock = 10;
    paVar10->objectsperblockmark = 0x3ff;
    paVar10->toparraylen = 0;
    paVar10->toparray = (char **)0x0;
    paVar10->objects = 0;
    paVar10->totalmemory = 0;
    memorypool::traversalinit(this->points);
    pdVar8 = pointtraverse(this);
    while (pdVar8 != (point)0x0) {
      if ((*(int *)((long)pdVar8 + (long)this->pointmarkindex * 4 + 4) >> 8) - 5U < 4) {
        arraypool::newindex(paVar10,&local_48);
        *(point *)local_48 = pdVar8;
        unaff_RBP = local_48;
      }
      pdVar8 = pointtraverse(this);
    }
    lVar14 = paVar10->objects;
    if (0 < lVar14) {
      srand((uint)lVar14);
      lVar9 = 0;
      while (lVar9 < lVar14) {
        iVar7 = rand();
        uVar11 = iVar7 % (int)(lVar9 + 1);
        bVar2 = (byte)paVar10->log2objectsperblock;
        pcVar4 = paVar10->toparray[(uint)lVar9 >> (bVar2 & 0x1f)];
        iVar7 = ((uint)lVar9 & paVar10->objectsperblockmark) * paVar10->objectbytes;
        pcVar5 = paVar10->toparray[(int)uVar11 >> (bVar2 & 0x1f)];
        iVar12 = (paVar10->objectsperblockmark & uVar11) * paVar10->objectbytes;
        unaff_RBP = pcVar5 + iVar12;
        uVar6 = *(undefined8 *)(pcVar4 + iVar7);
        *(undefined8 *)(pcVar4 + iVar7) = *(undefined8 *)(pcVar5 + iVar12);
        *(undefined8 *)(pcVar5 + iVar12) = uVar6;
        lVar9 = lVar9 + 1;
      }
      uVar11 = (uint)((double)lVar14 * this->b->coarsen_percent);
      uVar13 = 0;
      local_48 = unaff_RBP;
      local_38 = remptlist;
      if ((int)uVar11 < 1) {
        uVar11 = uVar13;
      }
      for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        pcVar4 = paVar10->toparray[uVar13 >> ((byte)paVar10->log2objectsperblock & 0x1f)];
        lVar14 = (long)paVar10->objectbytes * (long)(int)(paVar10->objectsperblockmark & uVar13);
        if ((*(byte *)(*(long *)(pcVar4 + lVar14) + 4 + (long)this->pointmarkindex * 4) & 1) == 0) {
          arraypool::newindex(remptlist,&local_48);
          *(undefined8 *)local_48 = *(undefined8 *)(pcVar4 + lVar14);
          remptlist = local_38;
        }
      }
    }
    arraypool::~arraypool(paVar10);
    operator_delete(paVar10,0x30);
  }
  lVar9 = 0;
  lVar14 = remptlist->objects;
  if (remptlist->objects < 1) {
    lVar14 = lVar9;
  }
  for (; lVar14 != lVar9; lVar9 = lVar9 + 1) {
    puVar1 = (uint *)(*(long *)(remptlist->toparray
                                [(uint)lVar9 >> ((byte)remptlist->log2objectsperblock & 0x1f)] +
                               (long)remptlist->objectbytes *
                               (long)(int)(remptlist->objectsperblockmark & (uint)lVar9)) + 4 +
                     (long)this->pointmarkindex * 4);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  return;
}

Assistant:

void tetgenmesh::collectremovepoints(arraypool *remptlist)
{
  point ptloop, *parypt;
  verttype vt;

  // If a mesh sizing function is given. Collect vertices whose mesh size
  //   is greater than its smallest edge length.
  if (b->metric) { // -m option
    REAL len, smlen;
    int i;
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      if (ptloop[pointmtrindex] > 0) {
        // Get the smallest edge length at this vertex.
        getvertexstar(1, ptloop, cavetetlist, cavetetvertlist, NULL);
        parypt = (point *) fastlookup(cavetetvertlist, 0);
        smlen = distance(ptloop, *parypt);
        for (i = 1; i < cavetetvertlist->objects; i++) {
          parypt = (point *) fastlookup(cavetetvertlist, i);
          len = distance(ptloop, *parypt);
          if (len < smlen) {
            smlen = len;
          }
        }
        cavetetvertlist->restart();
        cavetetlist->restart();
        if (smlen < ptloop[pointmtrindex]) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      }
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld oversized points.\n", remptlist->objects); 
    }
  }

  // If 'in->pointmarkerlist' exists, Collect vertices with markers '-1'.
  if (in->pointmarkerlist != NULL) {
    long bak_count = remptlist->objects;
    points->traversalinit();
    ptloop = pointtraverse();
    int index = 0;
    while (ptloop != NULL) {
      if (index < in->numberofpoints) {
        if (in->pointmarkerlist[index] == -1) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      } else {
        // Remaining are not input points. Stop here.
        break; 
      }
      index++;
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld marked points.\n", remptlist->objects - bak_count); 
    }
  } // if (in->pointmarkerlist != NULL)

  if (b->coarsen_param > 0) { // -R1/#
    // Remove a coarsen_percent number of interior points.
    if (b->verbose > 1) {
      printf("    Coarsen %g percent of interior points.\n", 
             b->coarsen_percent * 100.0);
    }
    arraypool *intptlist = new arraypool(sizeof(point *), 10);
    // Count the total number of interior points.
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      vt = pointtype(ptloop);
      if ((vt == VOLVERTEX) || (vt == FREEVOLVERTEX) || 
          (vt == FREEFACETVERTEX) || (vt == FREESEGVERTEX)) {
        intptlist->newindex((void **) &parypt);
        *parypt = ptloop;
      }
      ptloop = pointtraverse();
    }
    if (intptlist->objects > 0l) {
      // Sort the list of points randomly.
      point *parypt_i, swappt;
      int randindex, i;
      srand(intptlist->objects);
      for (i = 0; i < intptlist->objects; i++) {
        randindex = rand() % (i + 1); // randomnation(i + 1);
        parypt_i = (point *) fastlookup(intptlist, i); 
        parypt = (point *) fastlookup(intptlist, randindex);
        // Swap this two points.
        swappt = *parypt_i;
        *parypt_i = *parypt;
        *parypt = swappt;
      }
      int remcount = (int) ((REAL) intptlist->objects * b->coarsen_percent);
      // Return the first remcount points.
      for (i = 0; i < remcount; i++) {
        parypt_i = (point *) fastlookup(intptlist, i);
        if (!pinfected(*parypt_i)) {
          pinfected(*parypt_i);
          remptlist->newindex((void **) &parypt);
          *parypt = *parypt_i;
        }
      }
    }
    delete intptlist;
  }

  // Unmark all collected vertices.
  for (int i = 0; i < remptlist->objects; i++) {
    parypt = (point *) fastlookup(remptlist, i);
    puninfect(*parypt);
  }
}